

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slider.cpp
# Opt level: O0

Component __thiscall
ftxui::Slider<long>(ftxui *this,ConstStringRef *label,long *value,long min,long max,long increment)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Component CVar1;
  undefined1 local_48 [24];
  long increment_local;
  long max_local;
  long min_local;
  long *value_local;
  ConstStringRef *label_local;
  
  local_48._16_8_ = increment;
  increment_local = max;
  max_local = min;
  min_local = (long)value;
  value_local = (long *)label;
  label_local = (ConstStringRef *)this;
  Make<ftxui::SliderBase<long>,ftxui::ConstStringRef,long*&,long&,long&,long&>
            ((ConstStringRef *)local_48,(long **)label,&min_local,&max_local,&increment_local);
  std::shared_ptr<ftxui::ComponentBase>::shared_ptr<ftxui::SliderBase<long>,void>
            ((shared_ptr<ftxui::ComponentBase> *)this,
             (shared_ptr<ftxui::SliderBase<long>_> *)local_48);
  std::shared_ptr<ftxui::SliderBase<long>_>::~shared_ptr
            ((shared_ptr<ftxui::SliderBase<long>_> *)local_48);
  CVar1.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  CVar1.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Component)CVar1.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Component Slider(ConstStringRef label, T* value, T min, T max, T increment) {
  return Make<SliderBase<T>>(std::move(label), value, min, max, increment);
}